

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O1

size_t __thiscall TimeStampResp::SetDataSize(TimeStampResp *this)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  
  uVar1 = (this->status).super_DerBase.cbData;
  lVar5 = 2;
  lVar4 = 2;
  if ((((0x7f < uVar1) && (lVar4 = 3, 0xff < uVar1)) && (lVar4 = 4, 0xffff < uVar1)) &&
     (((lVar4 = 5, 0xffffff < uVar1 && (lVar4 = 6, uVar1 >> 0x20 != 0)) &&
      (lVar4 = 7, uVar1 >> 0x28 != 0)))) {
    lVar4 = (ulong)(uVar1 >> 0x30 == 0) << 3;
  }
  uVar2 = (this->timeStampToken).super_DerBase.cbData;
  if (((0x7f < uVar2) && (lVar5 = 3, 0xff < uVar2)) &&
     ((lVar5 = 4, 0xffff < uVar2 &&
      (((lVar5 = 5, 0xffffff < uVar2 && (lVar5 = 6, uVar2 >> 0x20 != 0)) &&
       (lVar5 = 7, uVar2 >> 0x28 != 0)))))) {
    lVar5 = (ulong)(uVar2 >> 0x30 == 0) << 3;
  }
  sVar3 = uVar2 + lVar5 + lVar4 + uVar1;
  (this->super_DerBase).cbData = sVar3;
  return sVar3;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData = status.EncodedSize() + timeStampToken.EncodedSize();
		return cbData;
	}